

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void dlib::
     hsort_array<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *array,unsigned_long left,unsigned_long right,case_insensitive_compare *comp)

{
  ulong uVar1;
  long lVar2;
  unsigned_long i;
  bool bVar3;
  
  if (right - left < 0x1e) {
    isort_array<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
              (array,left,right,comp);
    return;
  }
  uVar1 = right - left >> 1;
  do {
    sort_helpers::
    heapify<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
              (array,left,right,left + uVar1,comp);
    bVar3 = uVar1 != 0;
    uVar1 = uVar1 - 1;
  } while (bVar3);
  if (left < right) {
    lVar2 = right << 5;
    do {
      std::__cxx11::string::swap
                ((string *)
                 ((long)&(((array->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2));
      right = right - 1;
      sort_helpers::
      heapify<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,dlib::open_file_box_helper::case_insensitive_compare>
                (array,left,right,left,comp);
      lVar2 = lVar2 + -0x20;
    } while (left < right);
  }
  return;
}

Assistant:

void hsort_array (
        T& array,
        const unsigned long left,
        const unsigned long right,
        const compare& comp
    )
    {
        DLIB_ASSERT (left <= right,
                "\tvoid hsort_array()"
                << "\n\tleft:          " << left
                << "\n\tright:         " << right );

        if (right-left < 30)
        {
            isort_array(array,left,right,comp);
            return;
        }

        // turn array into a max heap
        for (unsigned long i = left+((right-left)>>1);; --i)
        {
            sort_helpers::heapify(array,left,right,i,comp);
            if (i == left)
                break;
        }

        // now sort the array
        for (unsigned long i = right; i > left;)
        {
            exchange(array[i],array[left]);
            sort_helpers::heapify(array,left,--i,left,comp);
        }
    }